

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalPtr<double,_int>::setConstant(SignalPtr<double,_int> *this,double *t)

{
  (*this->_vptr_SignalPtr[2])
            (this,(_func_int *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
  Signal<double,_int>::setConstant
            ((Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3])
             ,t);
  return;
}

Assistant:

virtual void setConstant(const T &t) {
    plug(this);
    Signal<T, Time>::setConstant(t);
  }